

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ResultBuilder::useActiveException(ResultBuilder *this,Flags resultDisposition)

{
  ResultBuilder *this_00;
  undefined4 in_ESI;
  long in_RDI;
  string local_30 [48];
  
  *(undefined4 *)(in_RDI + 0x68) = in_ESI;
  this_00 = (ResultBuilder *)(in_RDI + 0x120);
  translateActiveException_abi_cxx11_();
  std::operator<<((ostream *)this_00,local_30);
  std::__cxx11::string::~string(local_30);
  captureResult(this_00,(OfType)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void ResultBuilder::useActiveException( ResultDisposition::Flags resultDisposition ) {
        m_assertionInfo.resultDisposition = resultDisposition;
        m_stream.oss << Catch::translateActiveException();
        captureResult( ResultWas::ThrewException );
    }